

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void printLineOrder(LineOrder lo)

{
  char *pcVar1;
  
  if (lo == RANDOM_Y) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"random y",8);
    return;
  }
  if (lo == DECREASING_Y) {
    pcVar1 = "decreasing y";
  }
  else {
    if (lo != INCREASING_Y) {
      std::ostream::operator<<((ostream *)&std::cout,lo);
      return;
    }
    pcVar1 = "increasing y";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,0xc);
  return;
}

Assistant:

void
printLineOrder (LineOrder lo)
{
    switch (lo)
    {
        case INCREASING_Y: cout << "increasing y"; break;

        case DECREASING_Y: cout << "decreasing y"; break;

        case RANDOM_Y: cout << "random y"; break;

        default: cout << int (lo); break;
    }
}